

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VariationalBayesEstimatorOnLDA.cpp
# Opt level: O1

void __thiscall VariationalBayesEstimatorOnLDA::updateNEx(VariationalBayesEstimatorOnLDA *this)

{
  uint uVar1;
  uint uVar2;
  pointer pvVar3;
  vector<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
  *pvVar4;
  long lVar5;
  pointer pdVar6;
  pointer pdVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  pointer pvVar11;
  ulong uVar12;
  long lVar13;
  double dVar14;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ndkBuf;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  nkvBuf;
  value_type_conflict2 local_90;
  VariationalBayesEstimatorOnLDA *local_88;
  long local_80;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_78;
  pointer local_60;
  long local_58;
  pointer local_50;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_48;
  
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_48,
           ((long)(this->_nkv).
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->_nkv).
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
           (allocator_type *)&local_78);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_78,
           ((long)(this->_ndk).
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)(this->_ndk).
                  super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555,
           (allocator_type *)&local_90);
  if ((this->_nkv).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      (this->_nkv).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    lVar10 = 0;
    uVar12 = 0;
    do {
      local_90 = 0.0;
      std::vector<double,_std::allocator<double>_>::_M_fill_assign
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&((local_48.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar10),(ulong)this->_V,&local_90);
      uVar12 = uVar12 + 1;
      uVar8 = ((long)(this->_nkv).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->_nkv).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
      lVar10 = lVar10 + 0x18;
    } while (uVar12 <= uVar8 && uVar8 - uVar12 != 0);
  }
  local_60 = (this->_ndk).
             super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  if ((this->_ndk).
      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish != local_60) {
    lVar10 = 0;
    uVar12 = 0;
    do {
      local_90 = 0.0;
      std::vector<double,_std::allocator<double>_>::_M_fill_assign
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&((local_78.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar10),(ulong)this->_K,&local_90);
      uVar12 = uVar12 + 1;
      local_60 = (this->_ndk).
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      uVar8 = ((long)(this->_ndk).
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)local_60 >> 3) *
              -0x5555555555555555;
      lVar10 = lVar10 + 0x18;
    } while (uVar12 <= uVar8 && uVar8 - uVar12 != 0);
  }
  local_50 = (this->_docVoca->
             super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
  lVar10 = (long)(this->_docVoca->
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish - (long)local_50;
  if (lVar10 != 0) {
    local_58 = (lVar10 >> 3) * -0x5555555555555555;
    uVar1 = this->_K;
    local_58 = local_58 + (ulong)(local_58 == 0);
    lVar10 = 0;
    do {
      local_80 = lVar10;
      lVar10 = *(long *)&local_50[local_80].
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data;
      lVar9 = (long)*(pointer *)
                     ((long)&local_50[local_80].
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data + 8) - lVar10;
      if (lVar9 != 0) {
        lVar9 = lVar9 >> 2;
        pvVar3 = (this->_qz).
                 super__Vector_base<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>,_std::allocator<std::vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pvVar4 = this->_frequencyMatrix;
        lVar13 = 0;
        do {
          if ((ulong)uVar1 != 0) {
            uVar8 = (ulong)*(uint *)(lVar10 + lVar13 * 4);
            dVar14 = (double)*(uint *)(*(long *)&(pvVar4->
                                                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                                                 )._M_impl.super__Vector_impl_data._M_start
                                                 [local_80].
                                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                 ._M_impl.super__Vector_impl_data + uVar8 * 4);
            lVar5 = *(long *)(*(long *)&pvVar3[local_80].
                                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                        ._M_impl.super__Vector_impl_data + lVar13 * 0x18);
            pdVar6 = local_78.
                     super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[local_80].
                     super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_start;
            uVar12 = 0;
            pvVar11 = local_48.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
            do {
              pdVar6[uVar12] = *(double *)(lVar5 + uVar12 * 8) * dVar14 + pdVar6[uVar12];
              pdVar7 = (pvVar11->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              pdVar7[uVar8] = *(double *)(lVar5 + uVar12 * 8) * dVar14 + pdVar7[uVar8];
              uVar12 = uVar12 + 1;
              pvVar11 = pvVar11 + 1;
            } while (uVar1 != uVar12);
          }
          lVar13 = lVar13 + 1;
        } while (lVar13 != lVar9 + (ulong)(lVar9 == 0));
      }
      lVar10 = local_80 + 1;
    } while (local_80 + 1 != local_58);
  }
  uVar1 = this->_D;
  if ((ulong)uVar1 != 0) {
    uVar2 = this->_K;
    uVar12 = 0;
    do {
      if ((ulong)uVar2 != 0) {
        pdVar6 = local_78.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar12].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        pdVar7 = local_60[uVar12].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_start;
        uVar8 = 0;
        do {
          pdVar7[uVar8] = pdVar6[uVar8];
          uVar8 = uVar8 + 1;
        } while (uVar2 != uVar8);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar1);
  }
  uVar1 = this->_K;
  if ((ulong)uVar1 != 0) {
    pdVar6 = (this->_nk).super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    uVar2 = this->_V;
    pvVar11 = (this->_nkv).
              super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    uVar12 = 0;
    do {
      pdVar6[uVar12] = 0.0;
      if ((ulong)uVar2 != 0) {
        pdVar7 = local_48.
                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar12].
                 super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
                 ._M_start;
        lVar10 = *(long *)&pvVar11[uVar12].super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data;
        uVar8 = 0;
        do {
          *(double *)(lVar10 + uVar8 * 8) = pdVar7[uVar8];
          pdVar6[uVar12] = pdVar7[uVar8] + pdVar6[uVar12];
          uVar8 = uVar8 + 1;
        } while (uVar2 != uVar8);
      }
      uVar12 = uVar12 + 1;
    } while (uVar12 != uVar1);
  }
  local_88 = this;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_78);
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_48);
  return;
}

Assistant:

void VariationalBayesEstimatorOnLDA::updateNEx(){//{{{
    vector<vector<double> > nkvBuf(_nkv.size()), ndkBuf(_ndk.size());
    for(int k=0;k<_nkv.size();k++)nkvBuf[k].assign(_V, 0);
    for(int d=0;d<_ndk.size();d++)ndkBuf[d].assign(_K, 0);
    for(int d=0;d<_docVoca.size();d++){
        for(int l=0; l<_docVoca[d].size(); l++){
            unsigned int v = _docVoca[d][l];
            for(int k=0; k<_K; k++){
                ndkBuf[d][k] += _qz[d][l][k] * _frequencyMatrix[d][v];
                nkvBuf[k][v] += _qz[d][l][k] * _frequencyMatrix[d][v];
            }
        }
    }
    for(int d=0;d<_D;d++){
        for(int k=0;k<_K;k++){
            _ndk[d][k] = ndkBuf[d][k];
        }
    }
    for(int k=0;k<_K;k++){
        _nk[k] = 0;
        for(int v=0;v<_V;v++){
            _nkv[k][v] = nkvBuf[k][v];
            _nk[k] += nkvBuf[k][v];
        }
    }

}